

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters_dense.h
# Opt level: O2

void __thiscall dense_parameters::shallow_copy(dense_parameters *this,dense_parameters *input)

{
  if (this->_seeded == false) {
    free(this->_begin);
  }
  this->_begin = input->_begin;
  this->_weight_mask = input->_weight_mask;
  this->_stride_shift = input->_stride_shift;
  this->_seeded = true;
  return;
}

Assistant:

void shallow_copy(const dense_parameters& input)
  {
    if (!_seeded)
      free(_begin);
    _begin = input._begin;
    _weight_mask = input._weight_mask;
    _stride_shift = input._stride_shift;
    _seeded = true;
  }